

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueLittleInt16::read
          (PLYValueLittleInt16 *this,int __fd,void *__buf,size_t __nbytes)

{
  byte *pbVar1;
  long *plVar2;
  byte bVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,__fd);
  pbVar1 = *(byte **)(CONCAT44(in_register_00000034,__fd) + 0x10);
  if (pbVar1 < *(byte **)(CONCAT44(in_register_00000034,__fd) + 0x18)) {
    bVar3 = *pbVar1;
    plVar2[2] = (long)(pbVar1 + 1);
  }
  else {
    bVar3 = (**(code **)(*plVar2 + 0x50))(plVar2);
  }
  this->value = (ushort)bVar3;
  pbVar1 = (byte *)plVar2[2];
  if (pbVar1 < (byte *)plVar2[3]) {
    uVar4 = (uint)*pbVar1;
    plVar2[2] = (long)(pbVar1 + 1);
  }
  else {
    uVar4 = (**(code **)(*plVar2 + 0x50))(plVar2);
  }
  this->value = this->value | (ushort)(uVar4 << 8);
  return (ulong)(uVar4 << 8);
}

Assistant:

void read(std::streambuf *in)
    {
      value=static_cast<short>(in->sbumpc()&0xff);
      value|=static_cast<short>(in->sbumpc()<<8);
    }